

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

int Curl_ssl_getsock(connectdata *conn,curl_socket_t *socks)

{
  ssl_connect_data *connssl;
  curl_socket_t *socks_local;
  connectdata *conn_local;
  
  if (conn->ssl[0].connecting_state == ssl_connect_2_writing) {
    *socks = conn->sock[0];
    conn_local._4_4_ = 0x10000;
  }
  else if (conn->ssl[0].connecting_state == ssl_connect_2_reading) {
    *socks = conn->sock[0];
    conn_local._4_4_ = 1;
  }
  else {
    conn_local._4_4_ = 0;
  }
  return conn_local._4_4_;
}

Assistant:

int Curl_ssl_getsock(struct connectdata *conn, curl_socket_t *socks)
{
  struct ssl_connect_data *connssl = &conn->ssl[FIRSTSOCKET];

  if(connssl->connecting_state == ssl_connect_2_writing) {
    /* write mode */
    socks[0] = conn->sock[FIRSTSOCKET];
    return GETSOCK_WRITESOCK(0);
  }
  if(connssl->connecting_state == ssl_connect_2_reading) {
    /* read mode */
    socks[0] = conn->sock[FIRSTSOCKET];
    return GETSOCK_READSOCK(0);
  }

  return GETSOCK_BLANK;
}